

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O0

void tcu::writeXmlCaselistsToFiles(TestPackageRoot *root,TestContext *testCtx,CommandLine *cmdLine)

{
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> data;
  State SVar1;
  CommandLine *this;
  Archive *archive;
  CaseListFilter *caseListFilter_00;
  char *__s;
  TestNode *this_00;
  char *__filename;
  Exception *pEVar2;
  undefined8 uVar3;
  CaseListFilter *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 uVar4;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  qpXmlWriter *local_178;
  qpXmlWriter *writer;
  FILE *file;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string filename;
  char *pkgName;
  TestNode *node;
  char *filenamePattern;
  TestHierarchyIterator iter;
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> local_60;
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *local_50;
  undefined1 local_40 [8];
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  CommandLine *cmdLine_local;
  TestContext *testCtx_local;
  TestPackageRoot *root_local;
  
  DefaultHierarchyInflater::DefaultHierarchyInflater
            ((DefaultHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8,testCtx);
  this = TestContext::getCommandLine(testCtx);
  archive = TestContext::getArchive(testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_60,
             this,archive);
  local_50 = de::details::MovePtr::operator_cast_to_PtrData(&local_60,(MovePtr *)this);
  data._8_8_ = in_stack_fffffffffffffda0;
  data.ptr = in_stack_fffffffffffffd98;
  de::details::MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
  MovePtr((MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *)
          local_40,data);
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::~MovePtr
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_60);
  caseListFilter_00 =
       de::details::
       UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
       operator*((UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  *)local_40);
  TestHierarchyIterator::TestHierarchyIterator
            ((TestHierarchyIterator *)&filenamePattern,root,
             (TestHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8,caseListFilter_00);
  __s = CommandLine::getCaseListExportFile(cmdLine);
  while( true ) {
    SVar1 = TestHierarchyIterator::getState((TestHierarchyIterator *)&filenamePattern);
    if (SVar1 == STATE_FINISHED) {
      TestHierarchyIterator::~TestHierarchyIterator((TestHierarchyIterator *)&filenamePattern);
      de::details::
      MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::~MovePtr
                ((MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  *)local_40);
      DefaultHierarchyInflater::~DefaultHierarchyInflater
                ((DefaultHierarchyInflater *)
                 &caseListFilter.
                  super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  .m_data.field_0x8);
      return;
    }
    this_00 = TestHierarchyIterator::getNode((TestHierarchyIterator *)&filenamePattern);
    filename.field_2._8_8_ = TestNode::getName(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,__s,&local_111);
    uVar4 = filename.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)uVar4,&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"xml",(allocator<char> *)((long)&file + 7));
    makePackageFilename((string *)local_f0,&local_110,&local_138,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    writer = (qpXmlWriter *)0x0;
    local_178 = (qpXmlWriter *)0x0;
    __filename = (char *)std::__cxx11::string::c_str();
    writer = (qpXmlWriter *)fopen(__filename,"wb");
    if ((FILE *)writer == (FILE *)0x0) break;
    local_178 = qpXmlWriter_createFileWriter((FILE *)writer,0,0);
    if (local_178 == (qpXmlWriter *)0x0) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"XML writer creation failed",&local_1c1);
      Exception::Exception(pEVar2,&local_1c0);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
    uVar4 = filename.field_2._8_8_;
    uVar3 = std::__cxx11::string::c_str();
    print("Writing test cases from \'%s\' to file \'%s\'..\n",uVar4,uVar3);
    writeXmlCaselist((TestHierarchyIterator *)&filenamePattern,local_178);
    qpXmlWriter_destroy(local_178);
    local_178 = (qpXmlWriter *)0x0;
    fclose((FILE *)writer);
    writer = (qpXmlWriter *)0x0;
    TestHierarchyIterator::next((TestHierarchyIterator *)&filenamePattern);
    std::__cxx11::string::~string((string *)local_f0);
  }
  local_199 = 1;
  pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
  std::operator+(&local_198,"Failed to open ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  Exception::Exception(pEVar2,&local_198);
  local_199 = 0;
  __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void writeXmlCaselistsToFiles (TestPackageRoot& root, TestContext& testCtx, const CommandLine& cmdLine)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));

	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);
	const char* const					filenamePattern = cmdLine.getCaseListExportFile();

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		const TestNode* node		= iter.getNode();
		const char*		pkgName		= node->getName();
		const string	filename	= makePackageFilename(filenamePattern, pkgName, "xml");

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
				  node->getNodeType() == NODETYPE_PACKAGE);

		FILE*			file	= DE_NULL;
		qpXmlWriter*	writer	= DE_NULL;

		try
		{
			file = fopen(filename.c_str(), "wb");
			if (!file)
				throw Exception("Failed to open " + filename);

			writer = qpXmlWriter_createFileWriter(file, DE_FALSE, DE_FALSE);
			if (!writer)
				throw Exception("XML writer creation failed");

			print("Writing test cases from '%s' to file '%s'..\n", pkgName, filename.c_str());

			writeXmlCaselist(iter, writer);

			qpXmlWriter_destroy(writer);
			writer = DE_NULL;

			fclose(file);
			file = DE_NULL;
		}
		catch (...)
		{
			if (writer)
				qpXmlWriter_destroy(writer);
			if (file)
				fclose(file);
			throw;
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}